

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gles31::Functional::PackHalf2x16Case::iterate(PackHalf2x16Case *this)

{
  ostringstream *poVar1;
  ostream *stream;
  uint uVar2;
  ShaderExecutor *pSVar3;
  Float<unsigned_short,_5,_10,_15,_3U> FVar4;
  Float<unsigned_short,_5,_10,_15,_3U> FVar5;
  deUint32 dVar6;
  deBool dVar7;
  deUint32 dVar8;
  Float<unsigned_int,_8,_23,_127,_3U> FVar9;
  Float<unsigned_int,_8,_23,_127,_3U> FVar10;
  int iVar11;
  int iVar12;
  char *description;
  float afVar13 [2];
  PackHalf2x16Case *pPVar14;
  int ndx;
  int iVar15;
  int c;
  long lVar16;
  deUint32 u32;
  void *out;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> inputs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  Random rnd;
  Vec2 v;
  int local_228;
  Float<unsigned_short,_5,_10,_15,_3U> local_222;
  Hex<8UL> local_220;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_218;
  PackHalf2x16Case *local_1f8;
  uint local_1ec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  ulong local_1c8;
  deRandom local_1c0;
  undefined1 local_1b0 [384];
  
  dVar6 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_1c0,dVar6 ^ 0x776002);
  local_218.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0._0_4_ = 0.0;
  local_1b0._4_4_ = 0.0;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_218,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = 0.5;
  local_1b0._4_4_ = 1.0;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_218,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = 1.0;
  local_1b0._4_4_ = 0.5;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_218,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = -0.5;
  local_1b0._4_4_ = 1.5;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_218,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = 0.25;
  local_1b0._4_4_ = 0.75;
  local_1f8 = this;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_218,
             (Vector<float,_2> *)local_1b0);
  iVar15 = 0;
  do {
    local_1b0._0_4_ = 0.0;
    local_1b0._4_4_ = 0.0;
    lVar16 = 0;
    do {
      dVar7 = deRandom_getBool(&local_1c0);
      dVar6 = deRandom_getUint32(&local_1c0);
      dVar8 = deRandom_getUint32(&local_1c0);
      iVar12 = (dVar6 / 0x1e) * -0x1f + dVar6 / 0x1e;
      *(uint *)(local_1b0 + lVar16 * 4) =
           (uint)(dVar7 != 1) << 0x1f |
           (dVar6 + iVar12 + -0xe + (uint)(iVar12 + dVar6 == 0xe)) * 0x800000 + 0x3f800000 |
           dVar8 & 0x7fffff;
      lVar16 = lVar16 + 1;
    } while (lVar16 == 1);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              (&local_218,(value_type *)local_1b0);
    pPVar14 = local_1f8;
    iVar15 = iVar15 + 1;
  } while (iVar15 != 0x5f);
  if (local_218.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_218.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    afVar13 = (float  [2])
              local_218.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      local_220.value = local_220.value & 0xffffffffffff0000;
      local_1b0._0_4_ = *(float *)afVar13;
      FVar4 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                        ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0);
      local_220.value._0_2_ = FVar4.m_value;
      FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                        ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_220);
      local_222.m_value = 0;
      local_1b0._0_4_ = *(float *)((long)afVar13 + 4);
      local_222 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                            ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0);
      FVar10 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_222);
      *(StorageType_conflict *)afVar13 = FVar9.m_value;
      *(StorageType_conflict *)((long)afVar13 + 4) = FVar10.m_value;
      afVar13 = (float  [2])((long)afVar13 + 8);
    } while (afVar13 !=
             (float  [2])
             local_218.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_1e8,
             (long)local_218.
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_218.
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_1b0._0_8_ =
       ((pPVar14->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Executing shader for ",0x15)
  ;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  local_1b0._0_8_ =
       local_218.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_220.value =
       (deUint64)
       local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*((pPVar14->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar3 = (pPVar14->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar3->_vptr_ShaderExecutor[6])
            (pSVar3,(ulong)((long)local_218.
                                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_218.
                                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3,local_1b0,
             &local_220);
  local_1c8 = (ulong)((long)local_218.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_218.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3;
  if ((int)local_1c8 < 1) {
    local_228 = 0;
  }
  else {
    lVar16 = 0;
    local_228 = 0;
    do {
      local_1b0._0_4_ =
           *(float *)&((TestLog *)
                      ((long)local_218.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar16 * 8))->m_log;
      FVar4 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                        ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0);
      local_1b0._0_4_ =
           ((StorageType_conflict *)
           ((long)local_218.
                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4))[lVar16 * 2];
      FVar5 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                        ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0);
      pPVar14 = local_1f8;
      uVar2 = local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar16];
      local_1ec = (uint)FVar4.m_value;
      iVar12 = local_1ec - (uVar2 & 0xffff);
      iVar15 = -iVar12;
      if (0 < iVar12) {
        iVar15 = iVar12;
      }
      iVar11 = (uint)FVar5.m_value - (uVar2 >> 0x10);
      iVar12 = -iVar11;
      if (0 < iVar11) {
        iVar12 = iVar11;
      }
      if ((0 < iVar15) || (0 < iVar12)) {
        if (local_228 < 10) {
          local_1b0._0_8_ =
               ((local_1f8->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b0 + 8),"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(local_1b0 + 8,(int)lVar16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b0 + 8),", expected packHalf2x16(",0x18);
          tcu::operator<<((ostream *)(local_1b0 + 8),
                          (Vector<float,_2> *)
                          (lVar16 * 8 +
                          (long)local_218.
                                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_start));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),") = ",4);
          local_220.value = (deUint64)((uint)FVar5.m_value * 0x10000 + local_1ec);
          tcu::Format::Hex<8UL>::toStream(&local_220,(ostream *)(local_1b0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),", got ",6);
          stream = (ostream *)(local_1b0 + 8);
          local_220.value = (deUint64)(ulong)uVar2;
          tcu::Format::Hex<8UL>::toStream(&local_220,stream);
          std::__ostream_insert<char,std::char_traits<char>>(stream,"\n  diffs = (",0xc);
          std::ostream::operator<<(stream,iVar15);
          std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
          std::ostream::operator<<(stream,iVar12);
          std::__ostream_insert<char,std::char_traits<char>>(stream,"), max diff = ",0xe);
          std::ostream::operator<<(stream,0);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)stream);
          std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
          pPVar14 = local_1f8;
        }
        else {
          poVar1 = (ostringstream *)(local_1b0 + 8);
          if (local_228 == 10) {
            local_1b0._0_8_ =
                 ((local_1f8->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                  super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"...",3);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
          }
        }
        local_228 = local_228 + 1;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (int)((ulong)((long)local_218.
                                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_218.
                                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  local_1b0._0_8_ =
       ((pPVar14->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  iVar15 = (int)local_1c8;
  std::ostream::operator<<(poVar1,iVar15 - local_228);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
  std::ostream::operator<<(poVar1,iVar15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  description = "Pass";
  if (local_228 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((pPVar14->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode
             .m_testCtx,(uint)(local_228 != 0),description);
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((float  [2])
      local_218.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (float  [2])0x0) {
    operator_delete(local_218.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_218.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const int					maxDiff		= 0; // Values can be represented exactly in mediump.
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<tcu::Vec2>		inputs;
		std::vector<deUint32>		outputs;

		// Special values to check.
		inputs.push_back(tcu::Vec2(0.0f, 0.0f));
		inputs.push_back(tcu::Vec2(0.5f, 1.0f));
		inputs.push_back(tcu::Vec2(1.0f, 0.5f));
		inputs.push_back(tcu::Vec2(-0.5f, 1.5f));
		inputs.push_back(tcu::Vec2(0.25f, 0.75f));

		// Random values.
		{
			const int	minExp	= -14;
			const int	maxExp	= 15;

			for (int ndx = 0; ndx < 95; ndx++)
			{
				tcu::Vec2 v;
				for (int c = 0; c < 2; c++)
				{
					const int		s			= rnd.getBool() ? 1 : -1;
					const int		exp			= rnd.getInt(minExp, maxExp);
					const deUint32	mantissa	= rnd.getUint32() & ((1<<23)-1);

					v[c] = tcu::Float32::construct(s, exp ? exp : 1 /* avoid denormals */, (1u<<23) | mantissa).asFloat();
				}
				inputs.push_back(v);
			}
		}

		// Convert input values to fp16 and back to make sure they can be represented exactly in mediump.
		for (std::vector<tcu::Vec2>::iterator inVal = inputs.begin(); inVal != inputs.end(); ++inVal)
			*inVal = tcu::Vec2(tcu::Float16(inVal->x()).asFloat(), tcu::Float16(inVal->y()).asFloat());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	ref0	= (deUint16)tcu::Float16(inputs[valNdx].x()).bits();
				const deUint16	ref1	= (deUint16)tcu::Float16(inputs[valNdx].y()).bits();
				const deUint32	ref		= (ref1 << 16) | ref0;
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint16)(res & 0xffff);
				const deUint16	res1	= (deUint16)(res >> 16);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packHalf2x16(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}